

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::FindPackageStackRAII::~FindPackageStackRAII(FindPackageStackRAII *this)

{
  cmMakefile *pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer pcVar3;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  bool bVar6;
  cmFindPackageCall *pcVar7;
  cmFindPackageCall top;
  cmConstStack<cmFindPackageCall,_cmFindPackageStack> local_88;
  cmConstStack<cmFindPackageCall,_cmFindPackageStack> local_78;
  undefined1 local_68 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38 [2];
  uint local_28;
  
  pcVar7 = cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Top
                     (&(this->Makefile->FindPackageStack).
                       super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>);
  this->Makefile->FindPackageStackNextIndex = pcVar7->Index + 1;
  cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Pop(&local_78);
  _Var5._M_pi = local_78.TopEntry.
                super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  peVar4 = local_78.TopEntry.
           super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  pcVar1 = this->Makefile;
  local_78.TopEntry.
  super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_78.TopEntry.
  super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (pcVar1->FindPackageStack).super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>.
           TopEntry.
           super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (pcVar1->FindPackageStack).super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar4;
  (pcVar1->FindPackageStack).super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var5._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (local_78.TopEntry.
      super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.TopEntry.
               super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  bVar6 = cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Empty
                    (&(this->Makefile->FindPackageStack).
                      super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>);
  if (!bVar6) {
    pcVar7 = cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Top
                       (&(this->Makefile->FindPackageStack).
                         super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>);
    pcVar3 = (pcVar7->Name)._M_dataplus._M_p;
    local_78.TopEntry.
    super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar3,pcVar3 + (pcVar7->Name)._M_string_length);
    local_68._16_4_ = pcVar7->Index;
    cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Pop(&local_88);
    _Var5._M_pi = local_88.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    peVar4 = local_88.TopEntry.
             super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    pcVar1 = this->Makefile;
    local_88.TopEntry.
    super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_88.TopEntry.
    super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = (pcVar1->FindPackageStack).super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>.
             TopEntry.
             super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (pcVar1->FindPackageStack).super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar4;
    (pcVar1->FindPackageStack).super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = _Var5._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if (local_88.TopEntry.
        super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.TopEntry.
                 super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    pcVar1 = this->Makefile;
    local_68._16_4_ = pcVar1->FindPackageStackNextIndex;
    pcVar1->FindPackageStackNextIndex = local_68._16_4_ + 1;
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,
               local_78.TopEntry.
               super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,(undefined1 *)
                       ((long)&((local_78.TopEntry.
                                 super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->Value).Name._M_dataplus._M_p +
                       (long)&(local_78.TopEntry.
                               super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi)->_vptr__Sp_counted_base));
    local_28 = local_68._16_4_;
    cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Push
              (&local_88,(cmFindPackageCall *)&pcVar1->FindPackageStack);
    _Var5._M_pi = local_88.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    peVar4 = local_88.TopEntry.
             super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    pcVar1 = this->Makefile;
    local_88.TopEntry.
    super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_88.TopEntry.
    super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = (pcVar1->FindPackageStack).super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>.
             TopEntry.
             super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (pcVar1->FindPackageStack).super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar4;
    (pcVar1->FindPackageStack).super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = _Var5._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if (local_88.TopEntry.
        super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.TopEntry.
                 super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_48 != local_38) {
      operator_delete(local_48,(ulong)((long)&(local_38[0]._M_pi)->_vptr__Sp_counted_base + 1));
    }
    if (local_78.TopEntry.
        super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)local_68) {
      operator_delete(local_78.TopEntry.
                      super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,(ulong)(local_68._0_8_ + 1));
    }
  }
  return;
}

Assistant:

cmMakefile::FindPackageStackRAII::~FindPackageStackRAII()
{
  this->Makefile->FindPackageStackNextIndex =
    this->Makefile->FindPackageStack.Top().Index + 1;
  this->Makefile->FindPackageStack = this->Makefile->FindPackageStack.Pop();

  if (!this->Makefile->FindPackageStack.Empty()) {
    auto top = this->Makefile->FindPackageStack.Top();
    this->Makefile->FindPackageStack = this->Makefile->FindPackageStack.Pop();

    top.Index = this->Makefile->FindPackageStackNextIndex;
    this->Makefile->FindPackageStackNextIndex++;

    this->Makefile->FindPackageStack =
      this->Makefile->FindPackageStack.Push(top);
  }
}